

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

void spawn_stdin_stdout(void)

{
  size_t __n;
  ssize_t sVar1;
  int *piVar2;
  undefined8 uVar3;
  char *pcVar4;
  char buf [1024];
  
  do {
    while (__n = read(0,buf,0x400), __n != 0xffffffffffffffff) {
      if (__n == 0) {
        return;
      }
      pcVar4 = buf;
      if ((long)__n < 1) goto LAB_0014e5aa;
      for (; __n != 0; __n = __n - sVar1) {
        while (sVar1 = write(1,pcVar4,__n), sVar1 == -1) {
          piVar2 = __errno_location();
          if (*piVar2 != 4) goto LAB_0014e5de;
        }
        if (sVar1 < 0) {
LAB_0014e5de:
          pcVar4 = "w >= 0";
          uVar3 = 0x765;
          goto LAB_0014e602;
        }
        pcVar4 = pcVar4 + sVar1;
      }
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
LAB_0014e5aa:
  pcVar4 = "r > 0";
  uVar3 = 0x75e;
LAB_0014e602:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT(r > 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT(w >= 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}